

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<signed_char,unsigned_char>
          (BaseAppender *this,Vector *col,char input)

{
  bool bVar1;
  InvalidInputException *this_00;
  char input_00;
  uchar result;
  data_t local_39;
  string local_38;
  
  bVar1 = TryCast::Operation<signed_char,unsigned_char>(input,&local_39,false);
  if (bVar1) {
    col->data[(this->chunk).count] = local_39;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<signed_char,unsigned_char>(&local_38,(duckdb *)(ulong)(uint)(int)input,input_00)
  ;
  InvalidInputException::InvalidInputException(this_00,(string *)&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}